

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O3

QStringList * __thiscall
QConcatenateTablesProxyModel::mimeTypes
          (QStringList *__return_storage_ptr__,QConcatenateTablesProxyModel *this)

{
  if (*(long *)(*(long *)(this + 8) + 0xe8) == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (**(code **)(*(long *)**(undefined8 **)(*(long *)(this + 8) + 0xe0) + 200))
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QConcatenateTablesProxyModel::mimeTypes() const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_models.isEmpty())
        return QStringList();
    return d->m_models.at(0).model->mimeTypes();
}